

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeBufferReader::ReadDeferredStubs
          (ByteCodeBufferReader *this,byte *current,ByteCodeCache *cache,uint nestedCount,
          Type *deferredStubs,bool recurse)

{
  Type *addr;
  uint uVar1;
  code *pcVar2;
  undefined8 uVar3;
  Type TVar4;
  Type TVar5;
  undefined8 uVar6;
  Type TVar7;
  undefined8 uVar8;
  bool bVar9;
  BOOL BVar10;
  Recycler *pRVar11;
  undefined4 *puVar12;
  DeferredFunctionStub *pDVar13;
  DeferredFunctionStub *pDVar14;
  byte *pbVar15;
  int *piVar16;
  Type *addr_00;
  Type *value;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  undefined1 local_a8 [8];
  TrackAllocData data;
  byte *local_38;
  
  local_38 = current;
  if (nestedCount != 0) {
    uVar19 = (ulong)nestedCount;
    local_a8 = (undefined1  [8])&DeferredFunctionStub::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_37bc28c;
    data.filename._0_4_ = 0x11cd;
    data.plusSize = uVar19;
    pRVar11 = Memory::Recycler::TrackAllocInfo
                        (this->scriptContext->recycler,(TrackAllocData *)local_a8);
    BVar10 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar10 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar9) goto LAB_00892315;
      *puVar12 = 0;
    }
    pDVar13 = (DeferredFunctionStub *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                        (pRVar11,uVar19 * 0x68);
    if (pDVar13 == (DeferredFunctionStub *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar9) {
LAB_00892315:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar12 = 0;
    }
    pDVar14 = pDVar13;
    do {
      *(undefined4 *)((long)&(pDVar14->restorePoint).m_cMinTokMultiUnits + 4) = 0xffffffff;
      *(undefined4 *)&(pDVar14->restorePoint).m_cMinLineMultiUnits = 0xffffffff;
      *(undefined4 *)((long)&(pDVar14->restorePoint).m_cMinLineMultiUnits + 4) = 0xffffffff;
      (pDVar14->restorePoint).m_line = 0xffffffff;
      (pDVar14->restorePoint).m_ichMinTok = 0xffffffff;
      (pDVar14->restorePoint).m_ichMinLine = 0xffffffff;
      *(undefined4 *)&(pDVar14->restorePoint).m_cMinTokMultiUnits = 0xffffffff;
      *(undefined4 *)((long)&(pDVar14->restorePoint).m_cMinTokMultiUnits + 4) = 0xffffffff;
      *(undefined8 *)&(pDVar14->restorePoint).functionIdIncrement = 0;
      *(undefined8 *)((long)&(pDVar14->restorePoint).lengthDecr + 4) = 0;
      (pDVar14->restorePoint).m_cMultiUnits = 0xffffffffffffffff;
      (pDVar14->capturedNameSerializedIds).ptr = (int *)0x0;
      (pDVar14->capturedNamePointers).ptr =
           (BaseHashSet<Ident_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Ident_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            *)0x0;
      (pDVar14->deferredStubs).ptr = (DeferredFunctionStub *)0x0;
      (pDVar14->byteCodeCache).ptr = (ByteCodeCache *)0x0;
      pDVar14 = pDVar14 + 1;
    } while (pDVar14 != pDVar13 + uVar19);
    Memory::Recycler::WBSetBit((char *)deferredStubs);
    deferredStubs->ptr = pDVar13;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(deferredStubs);
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar19 = 0;
    do {
      pDVar14 = deferredStubs->ptr;
      addr_00 = &pDVar14[uVar19].byteCodeCache;
      Memory::Recycler::WBSetBit((char *)addr_00);
      addr_00->ptr = cache;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
      pbVar15 = ReadInt32(local_38,(size_t)(this->raw + ((long)this->totalSize - (long)local_38)),
                          (int *)&pDVar14[uVar19].ichMin);
      pDVar13 = pDVar14 + uVar19;
      pbVar15 = ReadInt32(pbVar15,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar15)),
                          (int *)&pDVar13->fncFlags);
      uVar3 = *(undefined8 *)pbVar15;
      TVar4 = *(Type *)(pbVar15 + 8);
      TVar5 = *(Type *)(pbVar15 + 0x10);
      uVar6 = *(undefined8 *)(pbVar15 + 0x18);
      TVar7 = *(Type *)(pbVar15 + 0x20);
      uVar8 = *(undefined8 *)(pbVar15 + 0x28);
      (pDVar13->restorePoint).m_ichMinTok = (int)uVar3;
      (pDVar13->restorePoint).m_ichMinLine = (int)((ulong)uVar3 >> 0x20);
      (pDVar13->restorePoint).m_cMinTokMultiUnits = TVar4;
      (pDVar13->restorePoint).m_cMinLineMultiUnits = TVar5;
      (pDVar13->restorePoint).m_line = (int)uVar6;
      (pDVar13->restorePoint).functionIdIncrement = (int)((ulong)uVar6 >> 0x20);
      (pDVar13->restorePoint).lengthDecr = TVar7;
      *(undefined8 *)&(pDVar13->restorePoint).m_fHadEol = uVar8;
      (pDVar13->restorePoint).m_cMultiUnits = *(Type *)(pbVar15 + 0x30);
      value = &pDVar14[uVar19].capturedNameCount;
      pbVar15 = ReadInt32(pbVar15 + 0x38,
                          (size_t)(this->raw + ((long)this->totalSize - (long)(pbVar15 + 0x38))),
                          (int *)value);
      data.plusSize = (size_t)*value;
      local_a8 = (undefined1  [8])&int::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_37bc28c;
      data.filename._0_4_ = 0x11dd;
      pRVar11 = Memory::Recycler::TrackAllocInfo
                          (this->scriptContext->recycler,(TrackAllocData *)local_a8);
      uVar1 = *value;
      data._32_8_ = value;
      if ((ulong)uVar1 == 0) {
        Memory::Recycler::ClearTrackAllocInfo(pRVar11,(TrackAllocData *)0x0);
        piVar16 = (int *)&DAT_00000008;
      }
      else {
        BVar10 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar10 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                      "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar9) goto LAB_00892315;
          *puVar12 = 0;
        }
        piVar16 = (int *)Memory::Recycler::
                         AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                                   (pRVar11,(ulong)uVar1 << 2);
        if (piVar16 == (int *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar9) goto LAB_00892315;
          *puVar12 = 0;
        }
      }
      addr = &pDVar14[uVar19].capturedNameSerializedIds;
      Memory::Recycler::WBSetBit((char *)addr);
      pDVar14[uVar19].capturedNameSerializedIds.ptr = piVar16;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      uVar3 = data._32_8_;
      if (pDVar14[uVar19].capturedNameCount != 0) {
        lVar18 = 0;
        uVar17 = 0;
        do {
          pbVar15 = ReadInt32(pbVar15,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar15)),
                              (int *)((long)addr->ptr + lVar18));
          uVar17 = uVar17 + 1;
          lVar18 = lVar18 + 4;
        } while (uVar17 < *(uint *)uVar3);
      }
      local_38 = ReadInt32(pbVar15,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar15)),
                           (int *)&pDVar14[uVar19].nestedCount);
      if (recurse) {
        local_38 = ReadDeferredStubs(this,local_38,cache,pDVar14[uVar19].nestedCount,
                                     &pDVar14[uVar19].deferredStubs,true);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != nestedCount + (nestedCount == 0));
  }
  return local_38;
}

Assistant:

const byte* ReadDeferredStubs(const byte* current, ByteCodeCache* cache, uint nestedCount, Field(DeferredFunctionStub*)* deferredStubs, bool recurse)
    {
        if (nestedCount == 0)
        {
            return current;
        }

        *deferredStubs = RecyclerNewArray(this->scriptContext->GetRecycler(), DeferredFunctionStub, nestedCount);

        for (uint i = 0; i < nestedCount; i++)
        {
            DeferredFunctionStub* nestedStub = *deferredStubs + i;

            nestedStub->byteCodeCache = cache;

            current = ReadUInt32(current, &nestedStub->ichMin);
            current = ReadUInt32(current, (uint*)&nestedStub->fncFlags);

            serialization_alignment RestorePoint* restorePoint;
            current = ReadStruct<RestorePoint>(current, &restorePoint);
            nestedStub->restorePoint = *restorePoint;

            current = ReadUInt32(current, &nestedStub->capturedNameCount);
            nestedStub->capturedNameSerializedIds = RecyclerNewArray(this->scriptContext->GetRecycler(), int, nestedStub->capturedNameCount);
            for (uint j = 0; j < nestedStub->capturedNameCount; j++)
            {
                current = ReadInt32(current, &nestedStub->capturedNameSerializedIds[j]);
            }

            current = ReadUInt32(current, &nestedStub->nestedCount);

            if (recurse)
            {
                current = ReadDeferredStubs(current, cache, nestedStub->nestedCount, &nestedStub->deferredStubs, recurse);
            }
        }

        return current;
    }